

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *
__thiscall
TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>::get_node
          (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
           *this,uint index)

{
  bool bVar1;
  const_reference ppvVar2;
  uint index_local;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
  *this_local;
  
  bVar1 = is_trie(this,index);
  if (!bVar1) {
    __assert_fail("is_trie(index)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                  ,0x3a,
                  "TrieNode<CharT, BucketT> *TrieNode<unsigned short, std::vector<unsigned char *>>::get_node(unsigned int) const [CharT = unsigned short, BucketT = std::vector<unsigned char *>]"
                 );
  }
  ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&this->_buckets,(ulong)index);
  return (TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
          *)((long)*ppvVar2 + -1);
}

Assistant:

TrieNode* get_node(unsigned index) const
	{
		assert(is_trie(index));
		return reinterpret_cast<TrieNode*>(
		       static_cast<char*>(_buckets[index])-1);
	}